

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O2

bool Imf_2_5::Attribute::knownType(char *typeName)

{
  iterator iVar1;
  key_type *in_RSI;
  undefined1 local_28 [8];
  Lock local_20;
  
  anon_unknown_0::typeMap();
  local_20._mutex = &anon_unknown_0::typeMap::tMap.mutex;
  std::mutex::lock(&anon_unknown_0::typeMap::tMap.mutex);
  local_20._locked = true;
  iVar1 = std::
          map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
          ::find((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                  *)local_28,in_RSI);
  IlmThread_2_5::Lock::~Lock(&local_20);
  return (_Rb_tree_header *)iVar1._M_node !=
         &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool		
Attribute::knownType (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    return tMap.find (typeName) != tMap.end();
}